

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketnotifier.cpp
# Opt level: O2

void __thiscall
QSocketNotifier::QSocketNotifier(QSocketNotifier *this,qintptr socket,Type type,QObject *parent)

{
  QObjectData *pQVar1;
  _func_int **pp_Var2;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QSocketNotifier(this,type,parent);
  pQVar1 = (this->super_QObject).d_ptr.d;
  *(int *)&pQVar1[1].children.d.size = (int)socket;
  pQVar1[1].field_0x30 = 1;
  if ((int)socket == -1) {
    local_38.context.version = 2;
    local_38.context.function._4_4_ = 0;
    local_38.context._4_8_ = 0;
    local_38.context._12_8_ = 0;
    local_38.context.category = "default";
    QMessageLogger::warning(&local_38,"QSocketNotifier: Invalid socket specified");
  }
  else if (pQVar1[1].q_ptr[6]._vptr_QObject == (_func_int **)0x0) {
    local_38.context.version = 2;
    local_38.context.function._4_4_ = 0;
    local_38.context._4_8_ = 0;
    local_38.context._12_8_ = 0;
    local_38.context.category = "default";
    QMessageLogger::warning
              (&local_38,"QSocketNotifier: Can only be used with threads started with QThread");
  }
  else {
    pp_Var2 = pQVar1[1].q_ptr[6]._vptr_QObject;
    (**(code **)(*pp_Var2 + 0x68))(pp_Var2,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSocketNotifier::QSocketNotifier(qintptr socket, Type type, QObject *parent)
    : QSocketNotifier(type, parent)
{
    Q_D(QSocketNotifier);

    d->sockfd = socket;
    d->snenabled = true;

    auto thisThreadData = d->threadData.loadRelaxed();

    if (!d->sockfd.isValid())
        qWarning("QSocketNotifier: Invalid socket specified");
    else if (!thisThreadData->hasEventDispatcher())
        qWarning("QSocketNotifier: Can only be used with threads started with QThread");
    else
        thisThreadData->eventDispatcher.loadRelaxed()->registerSocketNotifier(this);
}